

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SAXParseException.cpp
# Opt level: O0

SAXParseException * __thiscall
xercesc_4_0::SAXParseException::operator=(SAXParseException *this,SAXParseException *toAssign)

{
  MemoryManager *pMVar1;
  XMLCh *pXVar2;
  SAXParseException *toAssign_local;
  SAXParseException *this_local;
  
  if (this != toAssign) {
    pMVar1 = (this->super_SAXException).fMemoryManager;
    (*pMVar1->_vptr_MemoryManager[4])(pMVar1,this->fPublicId);
    pMVar1 = (this->super_SAXException).fMemoryManager;
    (*pMVar1->_vptr_MemoryManager[4])(pMVar1,this->fSystemId);
    SAXException::operator=(&this->super_SAXException,&toAssign->super_SAXException);
    this->fColumnNumber = toAssign->fColumnNumber;
    this->fLineNumber = toAssign->fLineNumber;
    pXVar2 = XMLString::replicate(toAssign->fPublicId,(this->super_SAXException).fMemoryManager);
    this->fPublicId = pXVar2;
    pXVar2 = XMLString::replicate(toAssign->fSystemId,(this->super_SAXException).fMemoryManager);
    this->fSystemId = pXVar2;
  }
  return this;
}

Assistant:

SAXParseException&
SAXParseException::operator=(const SAXParseException& toAssign)
{
    if (this == &toAssign)
        return *this;

    fMemoryManager->deallocate(fPublicId);//XMLString::release(&fPublicId);
    fMemoryManager->deallocate(fSystemId);//XMLString::release(&fSystemId);

    this->SAXException::operator =(toAssign);
    fColumnNumber = toAssign.fColumnNumber;
    fLineNumber = toAssign.fLineNumber;

    fPublicId = XMLString::replicate(toAssign.fPublicId, fMemoryManager);
    fSystemId = XMLString::replicate(toAssign.fSystemId, fMemoryManager);

    return *this;
}